

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeString(AsciiParser *this,StringData *str)

{
  bool bVar1;
  undefined8 uVar2;
  string local_230;
  string local_210;
  string local_1f0 [32];
  undefined8 local_1d0;
  size_t displayed_string_len;
  int iStack_1c0;
  char nc;
  char c;
  bool end_with_quotation;
  bool single_quote;
  char c0;
  Cursor start_cursor;
  uint64_t loc;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [376];
  StringData *local_20;
  StringData *str_local;
  AsciiParser *this_local;
  
  local_20 = str;
  str_local = (StringData *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  if (local_20 == (StringData *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    start_cursor = (Cursor)CurrLoc(this);
    _iStack_1c0 = this->_curr_cursor;
    bVar1 = Char1(this,(char *)((long)&displayed_string_len + 7));
    if (bVar1) {
      if ((displayed_string_len._7_1_ == '\"') || (displayed_string_len._7_1_ == '\'')) {
        displayed_string_len._6_1_ = displayed_string_len._7_1_ == '\'';
        displayed_string_len._5_1_ = 0;
        while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
          bVar1 = Char1(this,(char *)((long)&displayed_string_len + 4));
          if (!bVar1) {
            SeekTo(this,(uint64_t)start_cursor);
            this_local._7_1_ = 0;
            goto LAB_004ec549;
          }
          if ((displayed_string_len._4_1_ == '\n') || (displayed_string_len._4_1_ == '\r')) {
            SeekTo(this,(uint64_t)start_cursor);
            this_local._7_1_ = 0;
            goto LAB_004ec549;
          }
          if (displayed_string_len._4_1_ == '\\') {
            bVar1 = LookChar1(this,(char *)((long)&displayed_string_len + 3));
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_004ec549;
            }
            if (displayed_string_len._3_1_ == '\'') {
              ::std::operator<<(aoStack_198,"\'");
              StreamReader::seek_from_current(this->_sr,1);
            }
            else {
              if (displayed_string_len._3_1_ != '\"') goto LAB_004ec3f1;
              ::std::operator<<(aoStack_198,"\"");
              StreamReader::seek_from_current(this->_sr,1);
            }
          }
          else {
LAB_004ec3f1:
            if ((displayed_string_len._6_1_ & 1) == 0) {
              if (displayed_string_len._4_1_ == '\"') {
                displayed_string_len._5_1_ = 1;
                break;
              }
            }
            else if (displayed_string_len._4_1_ == '\'') {
              displayed_string_len._5_1_ = 1;
              break;
            }
            ::std::operator<<(aoStack_198,displayed_string_len._4_1_);
          }
        }
        if ((displayed_string_len._5_1_ & 1) == 0) {
          SeekTo(this,(uint64_t)start_cursor);
          this_local._7_1_ = 0;
        }
        else {
          ::std::__cxx11::stringstream::str();
          uVar2 = ::std::__cxx11::string::size();
          ::std::__cxx11::string::~string(local_1f0);
          local_1d0 = uVar2;
          ::std::__cxx11::stringstream::str();
          unescapeControlSequence(&local_210,&local_230);
          ::std::__cxx11::string::operator=((string *)local_20,(string *)&local_210);
          ::std::__cxx11::string::~string((string *)&local_210);
          ::std::__cxx11::string::~string((string *)&local_230);
          local_20->line_col = _c;
          local_20->line_row = iStack_1c0;
          local_20->is_triple_quoted = false;
          (this->_curr_cursor).col = (int)local_1d0 + 2 + (this->_curr_cursor).col;
          this_local._7_1_ = 1;
        }
      }
      else {
        SeekTo(this,(uint64_t)start_cursor);
        this_local._7_1_ = 0;
      }
    }
    else {
      SeekTo(this,(uint64_t)start_cursor);
      this_local._7_1_ = 0;
    }
  }
LAB_004ec549:
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::MaybeString(value::StringData *str) {
  std::stringstream ss;

  if (!str) {
    return false;
  }

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  char c0;
  if (!Char1(&c0)) {
    SeekTo(loc);
    return false;
  }

  // ' or " allowed.
  if ((c0 != '"') && (c0 != '\'')) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = (c0 == '\'');

  bool end_with_quotation{false};

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      SeekTo(loc);
      return false;
    }

    if ((c == '\n') || (c == '\r')) {
      SeekTo(loc);
      return false;
    }

    if (c == '\\') {
      // escaped quote? \" \'
      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == '\'') {
        ss << "'";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      } else if (nc == '"') {
        ss << "\"";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      }
    }

    if (single_quote) {
      if (c == '\'') {
        end_with_quotation = true;
        break;
      }
    } else {
      if (c == '"') {
        end_with_quotation = true;
        break;
      }
    }

    ss << c;
  }

  if (!end_with_quotation) {
    SeekTo(loc);
    return false;
  }

  DCOUT("Single quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  size_t displayed_string_len = ss.str().size();
  str->value = unescapeControlSequence(ss.str());
  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = false;

  _curr_cursor.col += int(displayed_string_len + 2);  // +2 for quotation chars

  return true;
}